

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::UnsafeArenaReleaseMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  OneofDescriptor *pOVar5;
  uint32 *puVar6;
  Message **ppMVar7;
  Message *ret;
  Message **result;
  MessageFactory *factory_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"ReleaseMessage",CPPTYPE_MESSAGE);
  }
  result = (Message **)factory;
  if (factory == (MessageFactory *)0x0) {
    result = (Message **)this->message_factory_;
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    this_local = (GeneratedMessageReflection *)
                 ExtensionSet::UnsafeArenaReleaseMessage(this_00,field,(MessageFactory *)result);
  }
  else {
    bVar1 = FieldDescriptor::is_repeated(field);
    if ((!bVar1) &&
       (pOVar5 = FieldDescriptor::containing_oneof(field), pOVar5 == (OneofDescriptor *)0x0)) {
      ClearBit(this,message,field);
    }
    pOVar5 = FieldDescriptor::containing_oneof(field);
    if (pOVar5 != (OneofDescriptor *)0x0) {
      bVar1 = HasOneofField(this,message,field);
      if (!bVar1) {
        return (Message *)0x0;
      }
      pOVar5 = FieldDescriptor::containing_oneof(field);
      puVar6 = MutableOneofCase(this,message,pOVar5);
      *puVar6 = 0;
    }
    ppMVar7 = MutableRaw<google::protobuf::Message*>(this,message,field);
    this_local = (GeneratedMessageReflection *)*ppMVar7;
    *ppMVar7 = (Message *)0x0;
  }
  return (Message *)this_local;
}

Assistant:

Message* GeneratedMessageReflection::UnsafeArenaReleaseMessage(
    Message* message,
    const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(ReleaseMessage, SINGULAR, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseMessage(field,
                                                                factory));
  } else {
    if (!(field->is_repeated() || field->containing_oneof())) {
      ClearBit(message, field);
    }
    if (field->containing_oneof()) {
      if (HasOneofField(*message, field)) {
        *MutableOneofCase(message, field->containing_oneof()) = 0;
      } else {
        return NULL;
      }
    }
    Message** result = MutableRaw<Message*>(message, field);
    Message* ret = *result;
    *result = NULL;
    return ret;
  }
}